

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

Maybe<const_kj::(anonymous_namespace)::InMemoryDirectory_&> __thiscall
kj::
dynamicDowncastIfAvailable<kj::(anonymous_namespace)::InMemoryDirectory_const,kj::Directory_const>
          (kj *this,Directory *from)

{
  InMemoryDirectory *local_38;
  Directory *from_local;
  
  if (from == (Directory *)0x0) {
    local_38 = (InMemoryDirectory *)0x0;
  }
  else {
    local_38 = (InMemoryDirectory *)
               __dynamic_cast(from,&Directory::typeinfo,
                              &(anonymous_namespace)::InMemoryDirectory::typeinfo,0);
  }
  Maybe<const_kj::(anonymous_namespace)::InMemoryDirectory_&>::Maybe
            ((Maybe<const_kj::(anonymous_namespace)::InMemoryDirectory_&> *)this,local_38);
  return (Maybe<const_kj::(anonymous_namespace)::InMemoryDirectory_&>)(InMemoryDirectory *)this;
}

Assistant:

Maybe<To&> dynamicDowncastIfAvailable(From& from) {
  // If RTTI is disabled, always returns kj::none.  Otherwise, works like dynamic_cast.  Useful
  // in situations where dynamic_cast could allow an optimization, but isn't strictly necessary
  // for correctness.  It is highly recommended that you try to arrange all your dynamic_casts
  // this way, as a dynamic_cast that is necessary for correctness implies a flaw in the interface
  // design.

  // Force a compile error if To is not a subtype of From.  Cross-casting is rare; if it is needed
  // we should have a separate cast function like dynamicCrosscastIfAvailable().
  if (false) {
    kj::implicitCast<From*>(kj::implicitCast<To*>(nullptr));
  }

#if KJ_NO_RTTI
  return kj::none;
#else
  return dynamic_cast<To*>(&from);
#endif
}